

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

ON_2dPoint __thiscall
ON_OBSOLETE_V5_DimAngular::Dim2dPoint(ON_OBSOLETE_V5_DimAngular *this,int point_index)

{
  ON_2dPoint *pOVar1;
  uint uVar2;
  int index;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Dd_00;
  double dVar7;
  double dVar8;
  ON_2dPoint OVar9;
  ON_2dPoint local_68;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  ON_2dPoint local_38;
  ON_2dVector v2;
  
  if ((point_index < 0) ||
     ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count < 4)
     ) {
switchD_004c43ed_default:
    dVar7 = -1.23432101234321e+308;
    dVar8 = -1.23432101234321e+308;
    goto LAB_004c4411;
  }
  uVar2 = 0x2713;
  if (((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext & 1U) != 0) {
    uVar2 = 0;
  }
  if (point_index != 10000) {
    uVar2 = point_index;
  }
  if (uVar2 < 4) {
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a +
             uVar2;
    uVar3 = *(undefined4 *)&pOVar1->x;
    uVar4 = *(undefined4 *)((long)&pOVar1->x + 4);
    uVar5 = *(undefined4 *)&pOVar1->y;
    uVar6 = *(undefined4 *)((long)&pOVar1->y + 4);
LAB_004c43ce:
    dVar8 = (double)CONCAT44(uVar6,uVar5);
    dVar7 = (double)CONCAT44(uVar4,uVar3);
    goto LAB_004c4411;
  }
  switch(uVar2) {
  case 0x2711:
    dVar7 = this->m_radius;
    dVar8 = 0.0;
    goto LAB_004c4411;
  case 0x2712:
    local_58 = this->m_radius;
    dStack_50 = 0.0;
    dVar7 = cos(this->m_angle);
    local_48._8_4_ = extraout_XMM0_Dc_00;
    local_48._0_8_ = dVar7;
    local_48._12_4_ = extraout_XMM0_Dd_00;
    dVar7 = this->m_angle;
    dStack_50 = this->m_radius;
    break;
  case 0x2713:
    local_58 = this->m_radius;
    dStack_50 = 0.0;
    dVar7 = cos(this->m_angle * 0.5);
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = dVar7;
    local_48._12_4_ = extraout_XMM0_Dd;
    dVar7 = this->m_angle * 0.5;
    dStack_50 = this->m_radius;
    break;
  case 0x2714:
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    goto LAB_004c43ce;
  case 0x2715:
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    dVar7 = pOVar1[1].x;
    dVar8 = pOVar1[1].y;
    local_68.x._0_4_ = SUB84(dVar7,0);
    local_68.x._4_4_ = (undefined4)((ulong)dVar7 >> 0x20);
    local_68.y._0_4_ = SUB84(dVar8,0);
    local_68.y._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
    index = 0;
    goto LAB_004c450a;
  case 0x2716:
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    dVar7 = pOVar1[2].x;
    dVar8 = pOVar1[2].y;
    local_68.x._0_4_ = SUB84(dVar7,0);
    local_68.x._4_4_ = (undefined4)((ulong)dVar7 >> 0x20);
    local_68.y._0_4_ = SUB84(dVar8,0);
    local_68.y._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
    index = 1;
LAB_004c450a:
    local_58 = DimpointOffset(this,index);
    dVar8 = (double)CONCAT44(local_68.y._4_4_,local_68.y._0_4_);
    dVar7 = (double)CONCAT44(local_68.x._4_4_,local_68.x._0_4_);
    if (0.0 <= local_58) {
      ON_2dVector::ON_2dVector(&v2,&local_68);
      ON_2dVector::Unitize(&v2);
      ON_2dPoint::ON_2dPoint(&local_38,&v2);
      OVar9 = ON_2dPoint::operator*(&local_38,local_58);
      dVar8 = OVar9.y;
      dVar7 = OVar9.x;
    }
    goto LAB_004c4411;
  default:
    goto switchD_004c43ed_default;
  }
  dVar8 = sin(dVar7);
  dVar7 = (double)local_48._0_8_ * local_58;
  dVar8 = dVar8 * dStack_50;
LAB_004c4411:
  local_68.y._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
  local_68.y._0_4_ = SUB84(dVar8,0);
  OVar9.y._0_4_ = local_68.y._0_4_;
  OVar9.x = dVar7;
  OVar9.y._4_4_ = local_68.y._4_4_;
  return OVar9;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_DimAngular::Dim2dPoint( int point_index ) const
{
  ON_2dPoint p2;
  if ( m_points.Count() < dim_pt_count || point_index < 0 )
  {
    p2.x = p2.y = ON_UNSET_VALUE;
  }
  else
  {
    if ( text_pivot_pt == point_index )
    {
      point_index = m_userpositionedtext 
                  ? userpositionedtext_pt_index
                  : arcmid_pt;
    }
    
    if ( point_index < dim_pt_count )
    {
      p2 = m_points[point_index];
    }
    else
    {
      switch(point_index)
      {
      case arcstart_pt:
        p2.x = m_radius;
        p2.y = 0.0;
        break;
      case arcend_pt:
        p2.x = m_radius*cos(m_angle);
        p2.y = m_radius*sin(m_angle);
        break;
      case arccenter_pt:
        p2.x = 0.0;
        p2.y = 0.0;
        break;
      case arcmid_pt:
        p2.x = m_radius*cos(0.5*m_angle);
        p2.y = m_radius*sin(0.5*m_angle);
        break;
      case extension0_pt:
        {
          p2 = m_points[start_pt_index];
          double dp0 = DimpointOffset(0);
          if(dp0 >= 0)
          {
            ON_2dVector v2 = (ON_2dVector)p2;
            v2.Unitize();
            p2 = (ON_2dPoint)v2 * dp0;
          }
        }
        break;
      case extension1_pt:
        {
          p2 = m_points[end_pt_index];
          double dp1 = DimpointOffset(1);
          if(dp1 >= 0)
          {
            ON_2dVector v2 = (ON_2dVector)p2;
            v2.Unitize();
            p2 = (ON_2dPoint)v2 * dp1;
          }
        }
        break;
      default:
        p2.x = p2.y = ON_UNSET_VALUE;
        break;
      }
    }
  }
  return p2;
}